

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan.c
# Opt level: O0

char ** glfwGetRequiredInstanceExtensions(uint32_t *count)

{
  GLFWbool GVar1;
  undefined4 *in_RDI;
  int unaff_retaddr;
  char **local_8;
  
  *in_RDI = 0;
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_8 = (char **)0x0;
  }
  else {
    GVar1 = _glfwInitVulkan(unaff_retaddr);
    if (GVar1 == 0) {
      local_8 = (char **)0x0;
    }
    else if (_glfw.vk.extensions[0] == (char *)0x0) {
      local_8 = (char **)0x0;
    }
    else {
      *in_RDI = 2;
      local_8 = _glfw.vk.extensions;
    }
  }
  return local_8;
}

Assistant:

GLFWAPI const char** glfwGetRequiredInstanceExtensions(uint32_t* count)
{
    assert(count != NULL);

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!_glfwInitVulkan(_GLFW_REQUIRE_LOADER))
        return NULL;

    if (!_glfw.vk.extensions[0])
        return NULL;

    *count = 2;
    return (const char**) _glfw.vk.extensions;
}